

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

int PostLoopFinalize(VP8EncIterator *it,int ok)

{
  VP8Encoder *enc;
  uint uVar1;
  int iVar2;
  uint64_t (*pauVar3) [3];
  int i;
  uint64_t (*pauVar4) [3];
  long lVar5;
  VP8BitWriter *bw;
  long lVar6;
  int (*paiVar7) [4];
  
  enc = it->enc_;
  if (ok != 0) {
    if (0 < enc->num_parts_) {
      bw = enc->parts_;
      lVar6 = 0;
      uVar1 = ok & 1;
      do {
        ok = uVar1;
        VP8BitWriterFinish(bw);
        uVar1 = 0;
        if (bw->error_ == 0) {
          uVar1 = ok;
        }
        lVar6 = lVar6 + 1;
        bw = bw + 1;
      } while (lVar6 < enc->num_parts_);
      if (uVar1 == 0) goto LAB_00136034;
    }
    if (enc->pic_->stats != (WebPAuxStats *)0x0) {
      pauVar3 = it->bit_count_;
      paiVar7 = enc->residual_bytes_;
      lVar6 = 0;
      do {
        lVar5 = 0;
        pauVar4 = pauVar3;
        do {
          *(ulong *)(*paiVar7 + lVar5) =
               CONCAT44((int)(pauVar4[1][0] + 7 >> 3),(int)((*pauVar4)[0] + 7 >> 3));
          lVar5 = lVar5 + 2;
          pauVar4 = pauVar4 + 2;
        } while (lVar5 != 4);
        lVar6 = lVar6 + 1;
        pauVar3 = (uint64_t (*) [3])(*pauVar3 + 1);
        paiVar7 = paiVar7 + 1;
      } while (lVar6 != 3);
    }
    VP8AdjustFilterStrength(it);
    return ok;
  }
LAB_00136034:
  VP8EncFreeBitWriters(enc);
  iVar2 = WebPEncodingSetError(enc->pic_,VP8_ENC_ERROR_OUT_OF_MEMORY);
  return iVar2;
}

Assistant:

static int PostLoopFinalize(VP8EncIterator* const it, int ok) {
  VP8Encoder* const enc = it->enc_;
  if (ok) {      // Finalize the partitions, check for extra errors.
    int p;
    for (p = 0; p < enc->num_parts_; ++p) {
      VP8BitWriterFinish(enc->parts_ + p);
      ok &= !enc->parts_[p].error_;
    }
  }

  if (ok) {      // All good. Finish up.
#if !defined(WEBP_DISABLE_STATS)
    if (enc->pic_->stats != NULL) {  // finalize byte counters...
      int i, s;
      for (i = 0; i <= 2; ++i) {
        for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
          enc->residual_bytes_[i][s] = (int)((it->bit_count_[s][i] + 7) >> 3);
        }
      }
    }
#endif
    VP8AdjustFilterStrength(it);     // ...and store filter stats.
  } else {
    // Something bad happened -> need to do some memory cleanup.
    VP8EncFreeBitWriters(enc);
    return WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return ok;
}